

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompilationUnitSymbols.cpp
# Opt level: O0

string_view __thiscall slang::ast::DefinitionSymbol::getKindString(DefinitionSymbol *this)

{
  int iVar1;
  long in_RDI;
  string_view sVar2;
  size_t in_stack_ffffffffffffffd8;
  uint in_stack_ffffffffffffffe0;
  undefined1 local_10 [16];
  
  iVar1 = *(int *)(in_RDI + 0x48);
  if (iVar1 == 0) {
    local_10 = (undefined1  [16])
               sv((char *)(ulong)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  }
  else if (iVar1 == 1) {
    local_10 = (undefined1  [16])
               sv((char *)CONCAT44(1,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffd8);
  }
  else {
    local_10 = (undefined1  [16])
               sv((char *)CONCAT44(iVar1,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffd8);
  }
  sVar2._M_len = local_10._0_8_;
  sVar2._M_str = (char *)local_10._8_8_;
  return sVar2;
}

Assistant:

std::string_view DefinitionSymbol::getKindString() const {
    switch (definitionKind) {
        case DefinitionKind::Module:
            return "module"sv;
        case DefinitionKind::Interface:
            return "interface"sv;
        case DefinitionKind::Program:
            return "program"sv;
    }
    SLANG_UNREACHABLE;
}